

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClass.c
# Opt level: O3

int Fra_ClassesRefine1(Fra_Cla_t *p,int fRefineNewClass,int *pSkipped)

{
  uint uVar1;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t **ppAVar3;
  int iVar4;
  Vec_Ptr_t *pVVar5;
  ulong uVar6;
  void **ppvVar7;
  Aig_Obj_t *pAVar8;
  uint uVar9;
  long lVar10;
  
  pVVar5 = p->vClasses1;
  if (pVVar5->nSize == 0) {
    iVar4 = 0;
  }
  else {
    if (pVVar5->nSize < 1) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
    if ((Aig_Obj_t *)*pVVar5->pArray == p->pAig->pConst1) {
      __assert_fail("Vec_PtrEntry(p->vClasses1,0) != Aig_ManConst1(p->pAig)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fra/fraClass.c"
                    ,0x217,"int Fra_ClassesRefine1(Fra_Cla_t *, int, int *)");
    }
    p->vClassNew->nSize = 0;
    iVar4 = pVVar5->nSize;
    if (iVar4 < 1) {
      uVar9 = 0;
    }
    else {
      lVar10 = 0;
      uVar9 = 0;
      do {
        pAVar2 = (Aig_Obj_t *)pVVar5->pArray[lVar10];
        iVar4 = (*p->pFuncNodeIsConst)(pAVar2);
        if (iVar4 == 0) {
          pVVar5 = p->vClassNew;
          uVar1 = pVVar5->nSize;
          if (uVar1 == pVVar5->nCap) {
            if ((int)uVar1 < 0x10) {
              if (pVVar5->pArray == (void **)0x0) {
                ppvVar7 = (void **)malloc(0x80);
              }
              else {
                ppvVar7 = (void **)realloc(pVVar5->pArray,0x80);
              }
              pVVar5->pArray = ppvVar7;
              pVVar5->nCap = 0x10;
            }
            else {
              if (pVVar5->pArray == (void **)0x0) {
                ppvVar7 = (void **)malloc((ulong)uVar1 << 4);
              }
              else {
                ppvVar7 = (void **)realloc(pVVar5->pArray,(ulong)uVar1 << 4);
              }
              pVVar5->pArray = ppvVar7;
              pVVar5->nCap = uVar1 * 2;
            }
          }
          else {
            ppvVar7 = pVVar5->pArray;
          }
          iVar4 = pVVar5->nSize;
          pVVar5->nSize = iVar4 + 1;
          ppvVar7 = ppvVar7 + iVar4;
        }
        else {
          if (((int)uVar9 < 0) || (p->vClasses1->nSize <= (int)uVar9)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                          ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
          }
          uVar6 = (ulong)uVar9;
          uVar9 = uVar9 + 1;
          ppvVar7 = p->vClasses1->pArray + uVar6;
        }
        *ppvVar7 = pAVar2;
        lVar10 = lVar10 + 1;
        pVVar5 = p->vClasses1;
        iVar4 = pVVar5->nSize;
      } while (lVar10 < iVar4);
    }
    if (iVar4 < (int)uVar9) {
      __assert_fail("p->nSize >= nSizeNew",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                    ,0x232,"void Vec_PtrShrink(Vec_Ptr_t *, int)");
    }
    pVVar5->nSize = uVar9;
    pVVar5 = p->vClassNew;
    iVar4 = pVVar5->nSize;
    if ((long)iVar4 != 0) {
      if (iVar4 == 1) {
        *(undefined8 *)
         (*(long *)(*(long *)(*(long *)((long)*pVVar5->pArray + 0x28) + 0x30) + 8) +
         (long)*(int *)((long)*pVVar5->pArray + 0x24) * 8) = 0;
        iVar4 = 1;
      }
      else {
        ppAVar3 = p->pMemClassesFree;
        p->pMemClassesFree = ppAVar3 + (long)iVar4 * 2;
        if (0 < iVar4) {
          lVar10 = 0;
          do {
            pAVar2 = (Aig_Obj_t *)pVVar5->pArray[lVar10];
            ppAVar3[lVar10] = pAVar2;
            ppAVar3[p->vClassNew->nSize + lVar10] = (Aig_Obj_t *)0x0;
            if (lVar10 == 0) {
              pAVar8 = (Aig_Obj_t *)0x0;
            }
            else {
              pAVar8 = *ppAVar3;
            }
            *(Aig_Obj_t **)
             (*(long *)(*(long *)((long)(pAVar2->field_5).pData + 0x30) + 8) + (long)pAVar2->Id * 8)
                 = pAVar8;
            lVar10 = lVar10 + 1;
            pVVar5 = p->vClassNew;
          } while (lVar10 < pVVar5->nSize);
        }
        if (*ppAVar3 == (Aig_Obj_t *)0x0) {
          __assert_fail("ppClass[0] != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fra/fraClass.c"
                        ,0x239,"int Fra_ClassesRefine1(Fra_Cla_t *, int, int *)");
        }
        pVVar5 = p->vClasses;
        uVar9 = pVVar5->nSize;
        if (uVar9 == pVVar5->nCap) {
          if ((int)uVar9 < 0x10) {
            if (pVVar5->pArray == (void **)0x0) {
              ppvVar7 = (void **)malloc(0x80);
            }
            else {
              ppvVar7 = (void **)realloc(pVVar5->pArray,0x80);
            }
            pVVar5->pArray = ppvVar7;
            pVVar5->nCap = 0x10;
          }
          else {
            if (pVVar5->pArray == (void **)0x0) {
              ppvVar7 = (void **)malloc((ulong)uVar9 << 4);
            }
            else {
              ppvVar7 = (void **)realloc(pVVar5->pArray,(ulong)uVar9 << 4);
            }
            pVVar5->pArray = ppvVar7;
            pVVar5->nCap = uVar9 * 2;
          }
        }
        else {
          ppvVar7 = pVVar5->pArray;
        }
        iVar4 = pVVar5->nSize;
        pVVar5->nSize = iVar4 + 1;
        ppvVar7[iVar4] = ppAVar3;
        if (fRefineNewClass == 0) {
          iVar4 = 1;
          if (pSkipped != (int *)0x0) {
            *pSkipped = *pSkipped + 1;
          }
        }
        else {
          iVar4 = Fra_RefineClassLastIter(p,p->vClasses);
          iVar4 = iVar4 + 1;
        }
      }
    }
  }
  return iVar4;
}

Assistant:

int Fra_ClassesRefine1( Fra_Cla_t * p, int fRefineNewClass, int * pSkipped )
{
    Aig_Obj_t * pObj, ** ppClass;
    int i, k, nRefis = 1;
    // check if there is anything to refine
    if ( Vec_PtrSize(p->vClasses1) == 0 )
        return 0;
    // make sure constant 1 class contains only non-constant nodes
    assert( Vec_PtrEntry(p->vClasses1,0) != Aig_ManConst1(p->pAig) );
    // collect all the nodes to be refined
    k = 0;
    Vec_PtrClear( p->vClassNew );
    Vec_PtrForEachEntry( Aig_Obj_t *, p->vClasses1, pObj, i )
    {
        if ( p->pFuncNodeIsConst( pObj ) )
            Vec_PtrWriteEntry( p->vClasses1, k++, pObj );
        else 
            Vec_PtrPush( p->vClassNew, pObj );
    }
    Vec_PtrShrink( p->vClasses1, k );
    if ( Vec_PtrSize(p->vClassNew) == 0 )
        return 0;
/*
    printf( "Refined const-1 class: {" );
    Vec_PtrForEachEntry( Aig_Obj_t *, p->vClassNew, pObj, i )
        printf( " %d", pObj->Id );
    printf( " }\n" );
*/
    if ( Vec_PtrSize(p->vClassNew) == 1 )
    {
        Fra_ClassObjSetRepr( (Aig_Obj_t *)Vec_PtrEntry(p->vClassNew,0), NULL );
        return 1;
    }
    // create a new class composed of these nodes
    ppClass = p->pMemClassesFree;
    p->pMemClassesFree += 2 * Vec_PtrSize(p->vClassNew);
    Vec_PtrForEachEntry( Aig_Obj_t *, p->vClassNew, pObj, i )
    {
        ppClass[i] = pObj;
        ppClass[Vec_PtrSize(p->vClassNew)+i] = NULL;
        Fra_ClassObjSetRepr( pObj, i? ppClass[0] : NULL );
    }
    assert( ppClass[0] != NULL );
    Vec_PtrPush( p->vClasses, ppClass );
    // iteratively refine this class
    if ( fRefineNewClass )
        nRefis += Fra_RefineClassLastIter( p, p->vClasses );
    else if ( pSkipped )
        (*pSkipped)++;
    return nRefis;
}